

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

int lua_closethread(lua_State *L,lua_State *from)

{
  int iVar1;
  uint local_20;
  int status;
  lua_State *from_local;
  lua_State *L_local;
  
  if (from == (lua_State *)0x0) {
    local_20 = 0;
  }
  else {
    local_20 = from->nCcalls & 0xffff;
  }
  L->nCcalls = local_20;
  iVar1 = luaE_resetthread(L,(uint)L->status);
  return iVar1;
}

Assistant:

LUA_API int lua_closethread (lua_State *L, lua_State *from) {
  int status;
  lua_lock(L);
  L->nCcalls = (from) ? getCcalls(from) : 0;
  status = luaE_resetthread(L, L->status);
  lua_unlock(L);
  return status;
}